

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

uint32_t GoodOAAT(char *key,int len,uint32_t seed)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uchar *str;
  
  uVar1 = seed >> 0x11 | seed << 0xf;
  uVar2 = seed ^ 0x3b00;
  for (lVar3 = 0; len != lVar3; lVar3 = lVar3 + 1) {
    uVar2 = (uVar2 + (byte)key[lVar3]) * 9;
    uVar1 = (uVar1 + uVar2 >> 0x19 | (uVar1 + uVar2) * 0x80) * 5;
  }
  uVar2 = (uVar1 >> 0x12 | uVar1 << 0xe) + (uVar2 ^ uVar1);
  uVar1 = (uVar2 >> 6 | uVar2 * 0x4000000) + (uVar1 ^ uVar2);
  uVar2 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar2 ^ uVar1);
  return (uVar2 >> 8 | uVar2 * 0x1000000) + (uVar1 ^ uVar2);
}

Assistant:

uint32_t
GoodOAAT(const char *key, int len, uint32_t seed) {
#define grol(x,n) (((x)<<(n))|((x)>>(32-(n))))
#define gror(x,n) (((x)>>(n))|((x)<<(32-(n))))
  unsigned char  *str = (unsigned char *)key;
  const unsigned char *const end = (const unsigned char *)str + len;
  uint32_t h1 = seed ^ 0x3b00;
  uint32_t h2 = grol(seed, 15);
  for (;str != end; str++) {
    h1 += str[0];
    h1 += h1 << 3; // h1 *= 9
    h2 += h1;
    // the rest could be as in MicroOAAT: h1 = grol(h1, 7)
    // but clang doesn't generate ROTL instruction then.
    h2 = grol(h2, 7);
    h2 += h2 << 2; // h2 *= 5
  }
  h1 ^= h2;
  /* now h1 passes all collision checks,
   * so it is suitable for hash-tables with prime numbers. */
  h1 += grol(h2, 14);
  h2 ^= h1; h2 += gror(h1, 6);
  h1 ^= h2; h1 += grol(h2, 5);
  h2 ^= h1; h2 += gror(h1, 8);
  return h2;
#undef grol
#undef gror
}